

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O2

void spdlog::details::fmt_helper::pad2(int n,memory_buf_t *dest)

{
  ushort uVar1;
  undefined4 in_EAX;
  byte bVar2;
  byte *value;
  undefined4 uStack_18;
  int local_14;
  
  value = (byte *)&uStack_18;
  _uStack_18 = CONCAT44(n,in_EAX);
  if (99 < n) {
    append_int<int>(n,dest);
    return;
  }
  if (n < 10) {
    if (n < 0) {
      ::fmt::v6::format_to<char[6],int&,250ul,char>(dest,(char (*) [6])"{:02}",&local_14);
      return;
    }
    uStack_18._0_2_ = CONCAT11(0x30,(byte)in_EAX);
    ::fmt::v6::internal::buffer<char>::push_back
              (&dest->super_buffer<char>,(char *)((long)&uStack_18 + 1));
    bVar2 = (char)n + 0x30;
  }
  else {
    uVar1 = (ushort)n & 0xff;
    _uStack_18 = CONCAT44(n,CONCAT13((char)(uVar1 / 10) + '0',(int3)in_EAX));
    ::fmt::v6::internal::buffer<char>::push_back
              (&dest->super_buffer<char>,(char *)((long)&uStack_18 + 3));
    bVar2 = (byte)(uVar1 % 10) | 0x30;
    value = (byte *)((long)&uStack_18 + 2);
  }
  *value = bVar2;
  ::fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,(char *)value);
  return;
}

Assistant:

inline void pad2(int n, memory_buf_t &dest)
{
    if (n > 99)
    {
        append_int(n, dest);
    }
    else if (n > 9) // 10-99
    {
        dest.push_back(static_cast<char>('0' + n / 10));
        dest.push_back(static_cast<char>('0' + n % 10));
    }
    else if (n >= 0) // 0-9
    {
        dest.push_back('0');
        dest.push_back(static_cast<char>('0' + n));
    }
    else // negatives (unlikely, but just in case, let fmt deal with it)
    {
        fmt::format_to(dest, "{:02}", n);
    }
}